

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynNew * ParseNew(ParseContext *ctx)

{
  Lexeme *begin;
  SynBase *pSVar1;
  int iVar2;
  SynBase *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SynBase *this_00;
  undefined4 extraout_var_01;
  SynNew *pSVar3;
  undefined4 extraout_var_03;
  Lexeme *pLVar4;
  LexemeType LVar5;
  SynBase *pSVar6;
  IntrusiveList<SynBase> IVar7;
  IntrusiveList<SynCallArgument> local_40;
  undefined4 extraout_var_02;
  
  begin = ctx->currentLexeme;
  if (begin->type != lex_new) {
    return (SynNew *)0x0;
  }
  ctx->currentLexeme = begin + 1;
  if (begin[1].type == lex_oparen) {
    ctx->currentLexeme = begin + 2;
    this = ParseType(ctx,(bool *)0x0,false);
    if (this == (SynBase *)0x0) {
      anon_unknown.dwarf_147a9::Report
                (ctx,ctx->currentLexeme,"ERROR: type name expected after \'new\'");
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      this = (SynBase *)CONCAT44(extraout_var,iVar2);
      SynError::SynError((SynError *)this,ctx->currentLexeme,ctx->currentLexeme);
    }
    anon_unknown.dwarf_147a9::CheckConsume
              (ctx,lex_cparen,"ERROR: matching \')\' not found after \'(\'");
    pLVar4 = ctx->currentLexeme;
    LVar5 = pLVar4->type;
    if (LVar5 != lex_obracket) goto LAB_00112e28;
  }
  else {
    this = ParseType(ctx,(bool *)0x0,true);
    if (this == (SynBase *)0x0) {
      anon_unknown.dwarf_147a9::Report
                (ctx,ctx->currentLexeme,"ERROR: type name expected after \'new\'");
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      this = (SynBase *)CONCAT44(extraout_var_00,iVar2);
      SynError::SynError((SynError *)this,ctx->currentLexeme,ctx->currentLexeme);
    }
    pLVar4 = ctx->currentLexeme;
    LVar5 = pLVar4->type;
    if (LVar5 != lex_obracket) {
      if (this->typeID != 9) {
LAB_00112e28:
        if (LVar5 == lex_oparen) {
          ctx->currentLexeme = pLVar4 + 1;
          local_40 = ParseCallArguments(ctx);
          anon_unknown.dwarf_147a9::CheckConsume
                    (ctx,lex_cparen,"ERROR: \')\' not found after function argument list");
          pLVar4 = ctx->currentLexeme;
          LVar5 = pLVar4->type;
        }
        else {
          local_40 = (IntrusiveList<SynCallArgument>)ZEXT816(0);
        }
        if (LVar5 == lex_ofigure) {
          ctx->currentLexeme = pLVar4 + 1;
          IVar7 = ParseExpressions(ctx);
          anon_unknown.dwarf_147a9::CheckConsume
                    (ctx,lex_cfigure,"ERROR: \'}\' not found after custom constructor body");
        }
        else {
          IVar7 = (IntrusiveList<SynBase>)ZEXT816(0);
        }
        iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x70);
        pSVar3 = (SynNew *)CONCAT44(extraout_var_03,iVar2);
        pLVar4 = ParseContext::Previous(ctx);
        SynBase::SynBase((SynBase *)pSVar3,0x20,begin,pLVar4);
        (pSVar3->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_0023f4c0;
        pSVar3->type = this;
        (pSVar3->arguments).head = local_40.head;
        (pSVar3->arguments).tail = local_40.tail;
        pSVar3->count = (SynBase *)0x0;
        pSVar3->constructor = IVar7;
        return pSVar3;
      }
      pSVar1 = *(SynBase **)&this[1].typeID;
      this_00 = (SynBase *)0x0;
      do {
        pSVar6 = this_00;
        this_00 = pSVar1;
        pSVar1 = this_00->next;
      } while (this_00->next != (SynBase *)0x0);
      if (this_00->typeID == 3) goto LAB_00112e28;
      if (pSVar6 == (SynBase *)0x0) {
        this = (SynBase *)this[1]._vptr_SynBase;
      }
      else {
        pSVar6->next = (SynBase *)0x0;
      }
      goto LAB_00112db0;
    }
  }
  ctx->currentLexeme = pLVar4 + 1;
  this_00 = ParseTernaryExpr(ctx);
  if (this_00 == (SynBase *)0x0) {
    anon_unknown.dwarf_147a9::Report
              (ctx,ctx->currentLexeme,"ERROR: expression not found after \'[\'");
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    this_00 = (SynBase *)CONCAT44(extraout_var_01,iVar2);
    SynError::SynError((SynError *)this_00,ctx->currentLexeme,ctx->currentLexeme);
  }
  anon_unknown.dwarf_147a9::CheckConsume(ctx,lex_cbracket,"ERROR: \']\' not found after expression")
  ;
LAB_00112db0:
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x70);
  pSVar3 = (SynNew *)CONCAT44(extraout_var_02,iVar2);
  pLVar4 = ParseContext::Previous(ctx);
  SynBase::SynBase((SynBase *)pSVar3,0x20,begin,pLVar4);
  (pSVar3->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_0023f4c0;
  pSVar3->type = this;
  (pSVar3->arguments).head = (SynCallArgument *)0x0;
  (pSVar3->arguments).tail = (SynCallArgument *)0x0;
  pSVar3->count = this_00;
  (pSVar3->constructor).head = (SynBase *)0x0;
  (pSVar3->constructor).tail = (SynBase *)0x0;
  return pSVar3;
}

Assistant:

SynNew* ParseNew(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_new))
	{
		SynBase *type = NULL;

		bool explicitType = ctx.Consume(lex_oparen);

		if(explicitType)
		{
			type = ParseType(ctx);

			if(!type)
			{
				Report(ctx, ctx.Current(), "ERROR: type name expected after 'new'");

				type = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}

			CheckConsume(ctx, lex_cparen, "ERROR: matching ')' not found after '('");
		}
		else
		{
			type = ParseType(ctx, NULL, true);

			if(!type)
			{
				Report(ctx, ctx.Current(), "ERROR: type name expected after 'new'");

				type = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}
		}

		IntrusiveList<SynCallArgument> arguments;

		IntrusiveList<SynBase> constructor;

		if(ctx.Consume(lex_obracket))
		{
			SynBase *count = ParseTernaryExpr(ctx);

			if(!count)
			{
				Report(ctx, ctx.Current(), "ERROR: expression not found after '['");

				count = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}

			CheckConsume(ctx, lex_cbracket, "ERROR: ']' not found after expression");

			return new (ctx.get<SynNew>()) SynNew(start, ctx.Previous(), type, arguments, count, constructor);
		}
		else if(!explicitType && isType<SynTypeArray>(type))
		{
			SynTypeArray *arrayType = getType<SynTypeArray>(type);

			// Try to extract last array type extent as a size
			SynBase *prevSize = NULL;
			SynBase *count = arrayType->sizes.head;

			while(count->next)
			{
				prevSize = count;
				count = count->next;
			}

			// Check if the extent is real
			if(!isType<SynNothing>(count))
			{
				if(prevSize)
					prevSize->next = NULL;
				else
					type = arrayType->type;

				return new (ctx.get<SynNew>()) SynNew(start, ctx.Previous(), type, arguments, count, constructor);
			}
		}

		if(ctx.Consume(lex_oparen))
		{
			arguments = ParseCallArguments(ctx);

			CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after function argument list");
		}

		if(ctx.Consume(lex_ofigure))
		{
			constructor = ParseExpressions(ctx);

			CheckConsume(ctx, lex_cfigure, "ERROR: '}' not found after custom constructor body");
		}

		return new (ctx.get<SynNew>()) SynNew(start, ctx.Previous(), type, arguments, NULL, constructor);
	}

	return NULL;
}